

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

Descriptor *
google::protobuf::anon_unknown_19::DefaultFinderFindAnyType
          (Message *message,string *prefix,string *name)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Descriptor *pDVar3;
  
  bVar1 = std::operator!=(prefix,"type.googleapis.com/");
  if (bVar1) {
    bVar1 = std::operator!=(prefix,"type.googleprod.com/");
    if (bVar1) {
      return (Descriptor *)0x0;
    }
  }
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  pDVar3 = DescriptorPool::FindMessageTypeByName
                     (*(DescriptorPool **)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) + 0x10),
                      name);
  return pDVar3;
}

Assistant:

const Descriptor* DefaultFinderFindAnyType(const Message& message,
                                           const std::string& prefix,
                                           const std::string& name) {
  if (prefix != internal::kTypeGoogleApisComPrefix &&
      prefix != internal::kTypeGoogleProdComPrefix) {
    return nullptr;
  }
  return message.GetDescriptor()->file()->pool()->FindMessageTypeByName(name);
}